

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void Utils::getDateFromPos(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  longlong lVar1;
  tm *__tp;
  char *__s;
  size_t sVar2;
  time_t rawtime;
  long local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,vec);
  lVar1 = vectEightBytesToUnsignedInt(&local_28,pos);
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_30 = lVar1 / 10000000 + -0x2b6109100;
  __tp = localtime(&local_30);
  __s = asctime(__tp);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c5128);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  return;
}

Assistant:

void Utils::getDateFromPos(std::vector<unsigned int> vec, int pos) {
    long long int time_l = vectEightBytesToUnsignedInt(vec, pos);
    time_t rawtime = convertWindowsTimeToUnixTime(time_l);
    struct tm * timeinfo;

    timeinfo = localtime(&rawtime);
    cout << asctime(timeinfo);
}